

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O1

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::FindNameOfFileContainingSymbol
          (EncodedDescriptorDatabase *this,string *symbol_name,string *output)

{
  byte bVar1;
  bool bVar2;
  uint32 uVar3;
  SourceCodeInfo *data;
  uint32 first_byte_or_zero;
  pair<const_void_*,_int> pVar4;
  undefined1 local_150 [8];
  FileDescriptorProto file_proto;
  CodedInputStream input;
  
  pVar4 = SimpleDescriptorDatabase::DescriptorIndex<std::pair<const_void_*,_int>_>::FindSymbol
                    (&this->index_,symbol_name);
  data = (SourceCodeInfo *)pVar4.first;
  first_byte_or_zero = 0;
  if (data == (SourceCodeInfo *)0x0) {
    return false;
  }
  if (0 < pVar4.second) {
    bVar1 = *(byte *)&(data->super_Message).super_MessageLite._vptr_MessageLite;
    first_byte_or_zero = (uint32)bVar1;
    uVar3 = (uint32)bVar1;
    if (-1 < (char)bVar1) {
      file_proto.source_code_info_ =
           (SourceCodeInfo *)((long)&(data->super_Message).super_MessageLite._vptr_MessageLite + 1);
      goto LAB_002b3fdc;
    }
  }
  file_proto.source_code_info_ = data;
  uVar3 = io::CodedInputStream::ReadTagFallback
                    ((CodedInputStream *)&file_proto.source_code_info_,first_byte_or_zero);
LAB_002b3fdc:
  if (uVar3 == 10) {
    bVar2 = internal::WireFormatLite::ReadBytes
                      ((CodedInputStream *)&file_proto.source_code_info_,output);
  }
  else {
    FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_150,(Arena *)0x0);
    bVar2 = MessageLite::ParseFromArray((MessageLite *)local_150,data,pVar4.second);
    if (bVar2) {
      std::__cxx11::string::_M_assign((string *)output);
    }
    FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_150);
  }
  io::CodedInputStream::~CodedInputStream((CodedInputStream *)&file_proto.source_code_info_);
  return bVar2;
}

Assistant:

bool EncodedDescriptorDatabase::FindNameOfFileContainingSymbol(
    const std::string& symbol_name, std::string* output) {
  std::pair<const void*, int> encoded_file = index_.FindSymbol(symbol_name);
  if (encoded_file.first == NULL) return false;

  // Optimization:  The name should be the first field in the encoded message.
  //   Try to just read it directly.
  io::CodedInputStream input(reinterpret_cast<const uint8*>(encoded_file.first),
                             encoded_file.second);

  const uint32 kNameTag = internal::WireFormatLite::MakeTag(
      FileDescriptorProto::kNameFieldNumber,
      internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED);

  if (input.ReadTagNoLastTag() == kNameTag) {
    // Success!
    return internal::WireFormatLite::ReadString(&input, output);
  } else {
    // Slow path.  Parse whole message.
    FileDescriptorProto file_proto;
    if (!file_proto.ParseFromArray(encoded_file.first, encoded_file.second)) {
      return false;
    }
    *output = file_proto.name();
    return true;
  }
}